

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O3

void Npn_ManWrite(Npn_Man_t *p,char *pFileName)

{
  int iVar1;
  ulong *Sign;
  int nSupp;
  uint uVar2;
  FILE *__stream;
  int *__ptr;
  void *pvVar3;
  int iVar4;
  Npn_Obj_t *pNVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  word *pwVar9;
  long lVar10;
  size_t __size;
  int iVar11;
  ulong __nmemb;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
    return;
  }
  iVar6 = p->nEntries;
  __ptr = (int *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar6 - 1U) {
    iVar11 = iVar6;
  }
  __ptr[1] = 0;
  *__ptr = iVar11;
  if (iVar11 == 0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = malloc((long)iVar11 << 3);
  }
  *(void **)(__ptr + 2) = pvVar3;
  iVar6 = p->nBins;
  if (0 < iVar6) {
    iVar4 = p->nBufferSize;
    uVar2 = 0;
    lVar8 = 0;
    do {
      iVar1 = p->pBins[lVar8];
      if (iVar4 <= iVar1) {
LAB_002ea862:
        __assert_fail("i < p->nBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcNpnSave.c"
                      ,0x31,"Npn_Obj_t *Npn_ManObj(Npn_Man_t *, int)");
      }
      if (iVar1 != 0) {
        pNVar5 = p->pBuffer + iVar1;
        lVar10 = (long)(int)uVar2;
        iVar6 = uVar2 * 2;
        __size = lVar10 << 4;
        while( true ) {
          if ((int)lVar10 == iVar11) {
            pvVar3 = *(void **)(__ptr + 2);
            if (lVar10 < 0x10) {
              if (pvVar3 == (void *)0x0) {
                pvVar3 = malloc(0x80);
              }
              else {
                pvVar3 = realloc(pvVar3,0x80);
              }
              *(void **)(__ptr + 2) = pvVar3;
              iVar11 = 0x10;
            }
            else {
              if (pvVar3 == (void *)0x0) {
                pvVar3 = malloc(__size);
              }
              else {
                pvVar3 = realloc(pvVar3,__size);
              }
              *(void **)(__ptr + 2) = pvVar3;
              iVar11 = iVar6;
            }
          }
          else {
            pvVar3 = *(void **)(__ptr + 2);
          }
          *(Npn_Obj_t **)((long)pvVar3 + lVar10 * 8) = pNVar5;
          iVar1 = pNVar5->iNext;
          iVar4 = p->nBufferSize;
          if (iVar4 <= iVar1) goto LAB_002ea862;
          if (iVar1 == 0) break;
          pNVar5 = p->pBuffer + iVar1;
          iVar6 = iVar6 + 2;
          __size = __size + 0x10;
          lVar10 = lVar10 + 1;
        }
        uVar2 = (int)lVar10 + 1;
        __ptr[1] = uVar2;
        *__ptr = iVar11;
        iVar6 = p->nBins;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
    if ((int)uVar2 < 2) {
      __nmemb = 1;
      if (uVar2 != 1) goto LAB_002ea82e;
    }
    else {
      __nmemb = (ulong)uVar2;
      qsort(*(void **)(__ptr + 2),__nmemb,8,Npn_ManCompareEntries);
    }
    lVar8 = *(long *)(__ptr + 2);
    uVar7 = 0;
    do {
      Sign = *(ulong **)(lVar8 + uVar7 * 8);
      Extra_PrintHexadecimal((FILE *)__stream,(uint *)Sign,6);
      pwVar9 = Truth;
      lVar10 = 0;
      uVar2 = 0;
      do {
        uVar2 = uVar2 + ((*pwVar9 & *Sign) >> ((byte)(1 << ((byte)lVar10 & 0x1f)) & 0x3f) !=
                        (~*pwVar9 & *Sign));
        lVar10 = lVar10 + 1;
        pwVar9 = pwVar9 + 1;
      } while (lVar10 != 6);
      fprintf(__stream," %d %d\n",(ulong)(uint)Sign[1],(ulong)uVar2);
      uVar7 = uVar7 + 1;
    } while (uVar7 != __nmemb);
  }
LAB_002ea82e:
  fclose(__stream);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Npn_ManWrite( Npn_Man_t * p, char * pFileName )
{
    Vec_Ptr_t * vEntries;
    Npn_Obj_t * pEntry;
    FILE * pFile = fopen( pFileName, "w" );
    int i;
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
        return;
    }
    vEntries = Vec_PtrAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEntry = Npn_ManObj(p, p->pBins[i]); pEntry; pEntry = Npn_ManObj(p, pEntry->iNext) )
            Vec_PtrPush( vEntries, pEntry );
    Vec_PtrSort( vEntries, (int (*)())Npn_ManCompareEntries );
    Vec_PtrForEachEntry( Npn_Obj_t *, vEntries, pEntry, i )
    {
        Extra_PrintHexadecimal( pFile, (unsigned *)&pEntry->uTruth, 6 );
        fprintf( pFile, " %d %d\n", pEntry->Count, Npn_TruthSuppSize(pEntry->uTruth, 6) );
    }
    fclose( pFile );
    Vec_PtrFree( vEntries );
}